

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

OpCode __thiscall
ByteCodeGenerator::GetLdSlotOp
          (ByteCodeGenerator *this,Scope *scope,int envIndex,RegSlot scopeLocation,
          FuncInfo *funcInfo)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  OpCode OVar4;
  undefined4 *puVar5;
  char *message;
  char *error;
  OpCode OVar6;
  uint lineNumber;
  
  if (envIndex == -1) {
    if (scopeLocation == 0xffffffff) {
LAB_0076567a:
      bVar2 = (byte)*(ushort *)&scope->field_0x44;
      if (scope->innerScopeIndex != 0xffffffff) {
        OVar4 = LdInnerSlot;
        OVar6 = LdInnerObjSlot;
        goto LAB_0076557c;
      }
      OVar6 = LdObjSlot;
      if ((*(ushort *)&scope->field_0x44 & 2) != 0) {
        return LdObjSlot;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      error = "(scope->GetIsObject())";
      message = "scope->GetIsObject()";
      lineNumber = 0x136e;
    }
    else if (funcInfo->frameSlotsRegister == scopeLocation) {
      if (scope->scopeType != ScopeType_Parameter) {
        return LdLocalSlot;
      }
      if (scope->func->currentChildScope == scope) {
        return LdLocalSlot;
      }
      OVar6 = LdParamSlot;
      if ((funcInfo->field_0xb5 & 0x80) == 0) {
        return LdParamSlot;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      error = "(!funcInfo->IsBodyAndParamScopeMerged())";
      message = "!funcInfo->IsBodyAndParamScopeMerged()";
      lineNumber = 0x134a;
    }
    else {
      if (funcInfo->frameObjRegister != scopeLocation) goto LAB_0076567a;
      if (scope->scopeType != ScopeType_Parameter) {
        return LdLocalObjSlot;
      }
      if (scope->func->currentChildScope == scope) {
        return LdLocalObjSlot;
      }
      OVar6 = LdParamObjSlot;
      if ((funcInfo->field_0xb5 & 0x80) == 0) {
        return LdParamObjSlot;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      error = "(!funcInfo->IsBodyAndParamScopeMerged())";
      message = "!funcInfo->IsBodyAndParamScopeMerged()";
      lineNumber = 0x1359;
    }
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,lineNumber,error,message);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  else {
    bVar2 = scope->field_0x44;
    OVar4 = LdEnvSlot;
    OVar6 = LdEnvObjSlot;
LAB_0076557c:
    if ((bVar2 & 2) == 0) {
      OVar6 = OVar4;
    }
  }
  return OVar6;
}

Assistant:

Js::OpCode
ByteCodeGenerator::GetLdSlotOp(Scope *scope, int envIndex, Js::RegSlot scopeLocation, FuncInfo *funcInfo)
{
    Js::OpCode op;

    if (envIndex != -1)
    {
        if (scope->GetIsObject())
        {
            op = Js::OpCode::LdEnvObjSlot;
        }
        else
        {
            op = Js::OpCode::LdEnvSlot;
        }
    }
    else if (scopeLocation != Js::Constants::NoRegister &&
        scopeLocation == funcInfo->frameSlotsRegister)
    {
        if (scope->GetScopeType() == ScopeType_Parameter && scope != scope->GetFunc()->GetCurrentChildScope())
        {
            // Symbol is from the param scope of a split scope function and we are emitting the body.
            // We should use the param scope's bytecode now.
            Assert(!funcInfo->IsBodyAndParamScopeMerged());
            op = Js::OpCode::LdParamSlot;
        }
        else
        {
            op = Js::OpCode::LdLocalSlot;
        }
    }
    else if (scopeLocation != Js::Constants::NoRegister &&
        scopeLocation == funcInfo->frameObjRegister)
    {
        if (scope->GetScopeType() == ScopeType_Parameter && scope != scope->GetFunc()->GetCurrentChildScope())
        {
            // Symbol is from the param scope of a split scope function and we are emitting the body.
            // We should use the param scope's bytecode now.
            Assert(!funcInfo->IsBodyAndParamScopeMerged());
            op = Js::OpCode::LdParamObjSlot;
        }
        else
        {
            op = Js::OpCode::LdLocalObjSlot;
        }
    }
    else if (scope->HasInnerScopeIndex())
    {
        if (scope->GetIsObject())
        {
            op = Js::OpCode::LdInnerObjSlot;
        }
        else
        {
            op = Js::OpCode::LdInnerSlot;
        }
    }
    else
    {
        AssertOrFailFast(scope->GetIsObject());
        op = Js::OpCode::LdObjSlot;
    }

    return op;
}